

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRef.c
# Opt level: O0

Rnm_Man_t * Rnm_ManStart(Gia_Man_t *pGia)

{
  int iVar1;
  Rnm_Man_t *pRVar2;
  Vec_Int_t *pVVar3;
  Vec_Str_t *pVVar4;
  Rnm_Obj_t *pRVar5;
  Rnm_Man_t *p;
  Gia_Man_t *pGia_local;
  
  iVar1 = Gia_ManPoNum(pGia);
  if (iVar1 == 1) {
    pRVar2 = (Rnm_Man_t *)calloc(1,0x80);
    pRVar2->pGia = pGia;
    pVVar3 = Vec_IntAlloc(100);
    pRVar2->vObjs = pVVar3;
    iVar1 = Gia_ManObjNum(pGia);
    pVVar4 = Vec_StrStart(iVar1);
    pRVar2->vCounts = pVVar4;
    pVVar3 = Vec_IntAlloc(1000);
    pRVar2->vFanins = pVVar3;
    pRVar2->nObjsAlloc = 10000;
    pRVar5 = (Rnm_Obj_t *)malloc((long)pRVar2->nObjsAlloc << 2);
    pRVar2->pObjs = pRVar5;
    if (pRVar2->pGia->vFanout == (Vec_Int_t *)0x0) {
      Gia_ManStaticFanoutStart(pRVar2->pGia);
    }
    Gia_ManCleanValue(pGia);
    Gia_ManCleanMark0(pGia);
    Gia_ManCleanMark1(pGia);
    return pRVar2;
  }
  __assert_fail("Gia_ManPoNum(pGia) == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absRef.c"
                ,0x10b,"Rnm_Man_t *Rnm_ManStart(Gia_Man_t *)");
}

Assistant:

Rnm_Man_t * Rnm_ManStart( Gia_Man_t * pGia )
{
    Rnm_Man_t * p;
    assert( Gia_ManPoNum(pGia) == 1 );
    p = ABC_CALLOC( Rnm_Man_t, 1 );
    p->pGia = pGia;
    p->vObjs = Vec_IntAlloc( 100 );
    p->vCounts = Vec_StrStart( Gia_ManObjNum(pGia) );
    p->vFanins = Vec_IntAlloc( 1000 );
//    p->vSatVars = Vec_IntAlloc( 0 );
//    p->vSat2Ids = Vec_IntAlloc( 1000 );
//    p->vIsopMem  = Vec_IntAlloc( 0 );
    p->nObjsAlloc = 10000;
    p->pObjs = ABC_ALLOC( Rnm_Obj_t, p->nObjsAlloc );
    if ( p->pGia->vFanout == NULL )
        Gia_ManStaticFanoutStart( p->pGia );
    Gia_ManCleanValue(pGia);
    Gia_ManCleanMark0(pGia);
    Gia_ManCleanMark1(pGia);
    return p;
}